

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

StringRef __thiscall llvm::ARM::getCanonicalArchName(ARM *this,StringRef Arch)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  StringRef Str;
  StringRef Str_00;
  StringRef SVar5;
  StringRef local_20;
  
  pcVar4 = Arch.Data;
  local_20.Length = (size_t)pcVar4;
  local_20.Data = (char *)this;
  if (pcVar4 < (char *)0x5) {
    pcVar1 = (char *)0xffffffffffffffff;
    if (pcVar4 < (char *)0x3) goto LAB_0017bd07;
    if (this[2] == (ARM)0x6d && *(short *)this == 0x7261) goto LAB_0017bcd8;
LAB_0017bcc6:
    pcVar1 = (char *)0xffffffffffffffff;
    if ((pcVar4 < (char *)0x7) || (*(int *)(this + 3) != 0x34366863 || *(int *)this != 0x63726161))
    goto LAB_0017bd2b;
    Str_00.Length = 2;
    Str_00.Data = "eb";
    sVar2 = StringRef::find(&local_20,Str_00,0);
    if (sVar2 == 0xffffffffffffffff) {
      pcVar3 = (char *)0x7;
      if (local_20.Length < (char *)0x7) {
        pcVar3 = (char *)local_20.Length;
      }
      pcVar1 = (char *)0x7;
      if (2 < local_20.Length - (long)pcVar3) {
        pcVar1 = (char *)((ulong)(((ARM *)(local_20.Data + 2))[(long)pcVar3] == (ARM)0x65 &&
                                 *(short *)(local_20.Data + (long)pcVar3) == 0x625f) * 3 + 7);
      }
      goto LAB_0017bce0;
    }
LAB_0017bdf9:
    this = (ARM *)0x1fac2f;
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar1 = (char *)0x5;
    if (this[4] != (ARM)0x34 || *(int *)this != 0x366d7261) {
      if (this[2] == (ARM)0x6d && *(short *)this == 0x7261) {
LAB_0017bcd8:
        pcVar1 = (char *)0x3;
      }
      else if (this[4] != (ARM)0x62 || *(int *)this != 0x6d756874) goto LAB_0017bcc6;
    }
LAB_0017bce0:
    pcVar3 = pcVar1;
    if (local_20.Length < pcVar1) {
      pcVar3 = (char *)local_20.Length;
    }
    if ((local_20.Length - (long)pcVar3 < 2) || (*(short *)(local_20.Data + (long)pcVar3) != 0x6265)
       ) {
LAB_0017bd07:
      if ((char *)0x1 < local_20.Length) {
LAB_0017bd2b:
        if (*(short *)((ARM *)(local_20.Data + -2) + local_20.Length) == 0x6265) {
          local_20.Length = (size_t)(local_20.Length + -2);
        }
      }
      if (pcVar1 != (char *)0xffffffffffffffff) goto LAB_0017bd4a;
      if ((char *)local_20.Length == (char *)0x0) goto LAB_0017bdfb;
    }
    else {
      pcVar1 = pcVar1 + 2;
LAB_0017bd4a:
      if (local_20.Length < pcVar1) {
        pcVar1 = (char *)local_20.Length;
      }
      local_20.Data = (char *)((ARM *)local_20.Data + (long)pcVar1);
      local_20.Length = local_20.Length + -(long)pcVar1;
      if ((char *)local_20.Length == (char *)0x0) goto LAB_0017bdfb;
      if (((char *)local_20.Length != (char *)0x1) &&
         (((ARM)*local_20.Data != (ARM)0x76 || (9 < (int)(char)((ARM *)local_20.Data)[1] - 0x30U))))
      goto LAB_0017bdf9;
      Str.Length = 2;
      Str.Data = "eb";
      sVar2 = StringRef::find(&local_20,Str,0);
      if (sVar2 != 0xffffffffffffffff) {
        this = (ARM *)0x1fac2f;
        pcVar4 = (char *)0x0;
        goto LAB_0017bdfb;
      }
    }
    pcVar4 = (char *)local_20.Length;
    this = (ARM *)local_20.Data;
  }
LAB_0017bdfb:
  SVar5.Length = (size_t)pcVar4;
  SVar5.Data = (char *)this;
  return SVar5;
}

Assistant:

StringRef llvm::ARM::getCanonicalArchName(StringRef Arch) {
  size_t offset = StringRef::npos;
  StringRef A = Arch;
  StringRef Error = "";

  // Begins with "arm" / "thumb", move past it.
  if (A.startswith("arm64"))
    offset = 5;
  else if (A.startswith("arm"))
    offset = 3;
  else if (A.startswith("thumb"))
    offset = 5;
  else if (A.startswith("aarch64")) {
    offset = 7;
    // AArch64 uses "_be", not "eb" suffix.
    if (A.find("eb") != StringRef::npos)
      return Error;
    if (A.substr(offset, 3) == "_be")
      offset += 3;
  }

  // Ex. "armebv7", move past the "eb".
  if (offset != StringRef::npos && A.substr(offset, 2) == "eb")
    offset += 2;
  // Or, if it ends with eb ("armv7eb"), chop it off.
  else if (A.endswith("eb"))
    A = A.substr(0, A.size() - 2);
  // Trim the head
  if (offset != StringRef::npos)
    A = A.substr(offset);

  // Empty string means offset reached the end, which means it's valid.
  if (A.empty())
    return Arch;

  // Only match non-marketing names
  if (offset != StringRef::npos) {
    // Must start with 'vN'.
    if (A.size() >= 2 && (A[0] != 'v' || !std::isdigit(A[1])))
      return Error;
    // Can't have an extra 'eb'.
    if (A.find("eb") != StringRef::npos)
      return Error;
  }

  // Arch will either be a 'v' name (v7a) or a marketing name (xscale).
  return A;
}